

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPReductionClause::generateDOT
          (OpenMPReductionClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OpenMPReductionClauseIdentifier OVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  ulong *puVar9;
  long *plVar10;
  size_type *psVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  pointer ppcVar16;
  uint uVar17;
  string __str_1;
  string node_id;
  string __str_6;
  string __str;
  string parameter_string;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string clause_kind;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  ofstream *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  undefined8 uStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  undefined8 local_118;
  char local_110;
  undefined7 uStack_10f;
  long *local_100 [2];
  long local_f0 [2];
  allocator<char> local_d9;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  OpenMPReductionClause *local_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_120 = &local_110;
  local_118 = 0;
  local_110 = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_168 = dot_file;
  local_58 = this;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)depth);
  uVar17 = -depth;
  if (0 < depth) {
    uVar17 = depth;
  }
  uVar15 = 1;
  if (9 < uVar17) {
    uVar13 = (ulong)uVar17;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar5 = (uint)uVar13;
      if (uVar5 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0015e783;
      }
      if (uVar5 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0015e783;
      }
      if (uVar5 < 10000) goto LAB_0015e783;
      uVar13 = uVar13 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar5);
    uVar15 = uVar15 + 1;
  }
LAB_0015e783:
  local_188 = &local_178;
  std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar15 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_188),uVar15,uVar17);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x1a5f58);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_1b8 = *puVar9;
    lStack_1b0 = plVar6[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar9;
    local_1c8 = (ulong *)*plVar6;
  }
  local_1c0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  puVar9 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar9) {
    local_150 = *puVar9;
    uStack_148 = puVar7[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar9;
    local_160 = (ulong *)*puVar7;
  }
  local_158 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  uVar17 = -index;
  if (0 < index) {
    uVar17 = index;
  }
  uVar15 = 1;
  if (9 < uVar17) {
    uVar13 = (ulong)uVar17;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar5 = (uint)uVar13;
      if (uVar5 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0015e8d9;
      }
      if (uVar5 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0015e8d9;
      }
      if (uVar5 < 10000) goto LAB_0015e8d9;
      uVar13 = uVar13 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar5);
    uVar15 = uVar15 + 1;
  }
LAB_0015e8d9:
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar15 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1e8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar15,uVar17);
  uVar13 = 0xf;
  if (local_160 != &local_150) {
    uVar13 = local_150;
  }
  paVar1 = &local_1e8.field_2;
  if (uVar13 < local_1e8._M_string_length + local_158) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      uVar14 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1e8._M_string_length + local_158) goto LAB_0015e95a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_160);
  }
  else {
LAB_0015e95a:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_98.field_2._M_allocated_capacity = *psVar11;
    local_98.field_2._8_8_ = puVar7[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar11;
    local_98._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_98._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  std::operator+(&local_1e8,&local_78,parent_node);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_178 = *plVar10;
    lStack_170 = plVar6[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *plVar10;
    local_188 = (long *)*plVar6;
  }
  local_180 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_188,(ulong)local_98._M_dataplus._M_p);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_1b8 = *puVar9;
    lStack_1b0 = plVar6[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar9;
    local_1c8 = (ulong *)*plVar6;
  }
  local_1c0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  puVar9 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar9) {
    local_150 = *puVar9;
    uStack_148 = puVar7[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar9;
    local_160 = (ulong *)*puVar7;
  }
  local_158 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_120,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = local_120;
  if (local_120 == (char *)0x0) {
    std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
  }
  else {
    sVar8 = strlen(local_120);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar12,sVar8);
  }
  std::__cxx11::string::append((char *)&local_78);
  OVar2 = local_58->identifier;
  local_158 = 0;
  local_150 = local_150 & 0xffffffffffffff00;
  local_160 = &local_150;
  if (((ulong)local_58->modifier < 3) &&
     (std::__cxx11::string::_M_replace
                ((ulong)&local_160,0,(char *)0x0,
                 (ulong)(&DAT_001a5da0 + *(int *)(&DAT_001a5da0 + (ulong)local_58->modifier * 4))),
     local_158 != 0)) {
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::append((char *)&local_1c8);
    std::operator+(&local_140,&local_78,&local_98);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_198 = *puVar9;
      lStack_190 = plVar6[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar9;
      local_1a8 = (ulong *)*plVar6;
    }
    local_1a0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1e8.field_2._M_allocated_capacity = *psVar11;
      local_1e8.field_2._8_8_ = plVar6[3];
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar11;
      local_1e8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1e8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_178 = *plVar10;
      lStack_170 = plVar6[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar10;
      local_188 = (long *)*plVar6;
    }
    local_180 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    paVar1 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar8 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar12,sVar8);
    }
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)local_100);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_100,(ulong)local_1c8);
    local_d8 = &local_c8;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_c8 = *plVar10;
      lStack_c0 = plVar6[3];
    }
    else {
      local_c8 = *plVar10;
      local_d8 = (long *)*plVar6;
    }
    local_d0 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_a8 = *plVar10;
      lStack_a0 = plVar6[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar10;
      local_b8 = (long *)*plVar6;
    }
    local_b0 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c8);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140.field_2._8_8_ = plVar6[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_140._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
    local_1a8 = &local_198;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_198 = *puVar9;
      lStack_190 = plVar6[3];
    }
    else {
      local_198 = *puVar9;
      local_1a8 = (ulong *)*plVar6;
    }
    local_1a0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_160);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    puVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_1e8.field_2._M_allocated_capacity = *puVar9;
      local_1e8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar9;
      local_1e8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1e8._M_string_length = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_178 = *plVar10;
      lStack_170 = plVar6[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar10;
      local_188 = (long *)*plVar6;
    }
    local_180 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    pcVar12 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar8 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar12,sVar8);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
  }
  local_158 = 0;
  *(undefined1 *)local_160 = 0;
  switch(OVar2) {
  case OMPC_REDUCTION_IDENTIFIER_plus:
    pcVar12 = "+";
    break;
  case OMPC_REDUCTION_IDENTIFIER_minus:
    pcVar12 = "-";
    break;
  case OMPC_REDUCTION_IDENTIFIER_mul:
    pcVar12 = "*";
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitand:
    pcVar12 = "&";
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitor:
    pcVar12 = "|";
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitxor:
    pcVar12 = "^";
    break;
  case OMPC_REDUCTION_IDENTIFIER_logand:
    pcVar12 = "&&";
    break;
  case OMPC_REDUCTION_IDENTIFIER_logor:
    pcVar12 = "||";
    break;
  default:
    goto switchD_0015f291_caseD_8;
  case OMPC_REDUCTION_IDENTIFIER_max:
    pcVar12 = "max";
    break;
  case OMPC_REDUCTION_IDENTIFIER_min:
    pcVar12 = "min";
    break;
  case OMPC_REDUCTION_IDENTIFIER_user:
    pcVar3 = (local_58->user_defined_identifier)._M_dataplus._M_p;
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar3,
               pcVar3 + (local_58->user_defined_identifier)._M_string_length,
               &switchD_0015f291::switchdataD_001a5c44,1);
    std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    goto switchD_0015f291_caseD_8;
  }
  std::__cxx11::string::_M_replace((ulong)&local_160,0,(char *)0x0,(ulong)pcVar12);
switchD_0015f291_caseD_8:
  if (local_158 != 0) {
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::append((char *)&local_1c8);
    std::operator+(&local_140,&local_78,&local_98);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_198 = *puVar9;
      lStack_190 = plVar6[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar9;
      local_1a8 = (ulong *)*plVar6;
    }
    local_1a0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1e8.field_2._M_allocated_capacity = *psVar11;
      local_1e8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar11;
      local_1e8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1e8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_178 = *plVar10;
      lStack_170 = plVar6[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar10;
      local_188 = (long *)*plVar6;
    }
    local_180 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    paVar1 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar8 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar12,sVar8);
    }
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)local_100);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_100,(ulong)local_1c8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_c8 = *plVar10;
      lStack_c0 = plVar6[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar10;
      local_d8 = (long *)*plVar6;
    }
    local_d0 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_a8 = *plVar10;
      lStack_a0 = plVar6[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar10;
      local_b8 = (long *)*plVar6;
    }
    local_b0 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c8);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140.field_2._8_8_ = plVar6[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_140._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_198 = *puVar9;
      lStack_190 = plVar6[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar9;
      local_1a8 = (ulong *)*plVar6;
    }
    local_1a0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_160);
    puVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_1e8.field_2._M_allocated_capacity = *puVar9;
      local_1e8.field_2._8_8_ = puVar7[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar9;
      local_1e8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1e8._M_string_length = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_178 = *plVar10;
      lStack_170 = plVar6[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar10;
      local_188 = (long *)*plVar6;
    }
    local_180 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    pcVar12 = local_120;
    if (local_120 == (char *)0x0) {
      std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
    }
    else {
      sVar8 = strlen(local_120);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar12,sVar8);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
  }
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = local_1b8 & 0xffffffffffffff00;
  ppcVar16 = (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar16 !=
      (local_58->super_OpenMPClause).expressions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar17 = 0;
    do {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      std::__cxx11::string::append((char *)&local_1e8);
      uVar15 = 1;
      if (9 < uVar17) {
        uVar13 = (ulong)uVar17;
        uVar4 = 4;
        do {
          uVar15 = uVar4;
          uVar5 = (uint)uVar13;
          if (uVar5 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_0015fa00;
          }
          if (uVar5 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_0015fa00;
          }
          if (uVar5 < 10000) goto LAB_0015fa00;
          uVar13 = uVar13 / 10000;
          uVar4 = uVar15 + 4;
        } while (99999 < uVar5);
        uVar15 = uVar15 + 1;
      }
LAB_0015fa00:
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar15);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a8,uVar15,uVar17);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        uVar14 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_1a0 + local_1e8._M_string_length) {
        uVar13 = 0xf;
        if (local_1a8 != &local_198) {
          uVar13 = local_198;
        }
        if (uVar13 < local_1a0 + local_1e8._M_string_length) goto LAB_0015fa6e;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p);
      }
      else {
LAB_0015fa6e:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_1a8);
      }
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_178 = *plVar6;
        lStack_170 = puVar7[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar6;
        local_188 = (long *)*puVar7;
      }
      local_180 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_188);
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_140,&local_78,&local_98);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_198 = *puVar9;
        lStack_190 = plVar6[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar9;
        local_1a8 = (ulong *)*plVar6;
      }
      local_1a0 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1e8.field_2._M_allocated_capacity = *psVar11;
        local_1e8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar11;
        local_1e8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1e8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_178 = *plVar6;
        lStack_170 = puVar7[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar6;
        local_188 = (long *)*puVar7;
      }
      local_180 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pcVar12 = local_120;
      if (local_120 == (char *)0x0) {
        std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
      }
      else {
        sVar8 = strlen(local_120);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar12,sVar8);
      }
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::string::append((char *)local_100);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_100,(ulong)local_1c8);
      local_d8 = &local_c8;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_c8 = *plVar10;
        lStack_c0 = plVar6[3];
      }
      else {
        local_c8 = *plVar10;
        local_d8 = (long *)*plVar6;
      }
      local_d0 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar6[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar6;
      }
      local_b0 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c8);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140.field_2._8_8_ = plVar6[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_140._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_198 = *puVar9;
        lStack_190 = plVar6[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *puVar9;
        local_1a8 = (ulong *)*plVar6;
      }
      local_1a0 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar16,&local_d9);
      uVar13 = 0xf;
      if (local_1a8 != &local_198) {
        uVar13 = local_198;
      }
      if (uVar13 < (ulong)(local_48 + local_1a0)) {
        uVar13 = 0xf;
        if (local_50 != local_40) {
          uVar13 = local_40[0];
        }
        if (uVar13 < (ulong)(local_48 + local_1a0)) goto LAB_0015ff47;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_1a8);
      }
      else {
LAB_0015ff47:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_50);
      }
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      puVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_1e8.field_2._M_allocated_capacity = *puVar9;
        local_1e8.field_2._8_8_ = puVar7[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *puVar9;
        local_1e8._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_1e8._M_string_length = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_178 = *plVar10;
        lStack_170 = plVar6[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar10;
        local_188 = (long *)*plVar6;
      }
      local_180 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_188);
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0] + 1);
      }
      pcVar12 = local_120;
      if (local_120 == (char *)0x0) {
        std::ios::clear((int)local_168 + (int)*(undefined8 *)(*(long *)local_168 + -0x18));
      }
      else {
        sVar8 = strlen(local_120);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_168,pcVar12,sVar8);
      }
      uVar17 = uVar17 + 1;
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 !=
             (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  return;
}

Assistant:

void OpenMPReductionClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "reduction_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPReductionClauseModifier modifier = this->getModifier();
    OpenMPReductionClauseIdentifier identifier = this->getIdentifier();
    std::string parameter_string;
    switch (modifier) {
        case OMPC_REDUCTION_MODIFIER_default:
            parameter_string = "default";
            break;
        case OMPC_REDUCTION_MODIFIER_inscan:
            parameter_string = "inscan";
            break;
        case OMPC_REDUCTION_MODIFIER_task:
            parameter_string = "task";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_modifier";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    parameter_string.clear();
    switch (identifier) {
        case OMPC_REDUCTION_IDENTIFIER_plus:
            parameter_string = "+";
            break;
        case OMPC_REDUCTION_IDENTIFIER_minus:
            parameter_string  = "-";
            break;
        case OMPC_REDUCTION_IDENTIFIER_mul:
            parameter_string = "*";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitand:
            parameter_string = "&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitor:
            parameter_string = "|";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitxor:
            parameter_string = "^";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logand:
            parameter_string = "&&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logor:
            parameter_string = "||";
            break;
        case OMPC_REDUCTION_IDENTIFIER_min:
            parameter_string = "min";
            break;
        case OMPC_REDUCTION_IDENTIFIER_max:
            parameter_string = "max";
            break;
        case OMPC_REDUCTION_IDENTIFIER_user:
            parameter_string = this->getUserDefinedIdentifier();
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_identifier";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}